

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

void __thiscall
dg::LLVMDependenceGraph::computeNTSCD
          (LLVMDependenceGraph *this,LLVMControlDependenceAnalysisOptions *opts)

{
  Module *module;
  _Base_ptr p_Var1;
  long lVar2;
  BBlock<dg::LLVMNode> *b;
  pointer ppVVar3;
  mapped_type *ppBVar4;
  LLVMNode *this_00;
  LLVMNode *n;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  Value *v;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  Value *dep;
  LLVMControlDependenceAnalysis ntscd;
  _Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> local_148;
  _Rb_tree_node_base *local_130;
  long local_128;
  long local_120;
  BasicBlock *local_118;
  key_type local_110;
  LLVMControlDependenceAnalysis local_108;
  LLVMControlDependenceAnalysisOptions local_90;
  
  module = this->module;
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(&local_90,opts);
  LLVMControlDependenceAnalysis::LLVMControlDependenceAnalysis
            (&local_108,module,&local_90,(LLVMPointerAnalysis *)0x0);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions(&local_90);
  local_130 = (_Rb_tree_node_base *)(constructedFunctions + 8);
  for (p_Var5 = (_Rb_tree_node_base *)constructedFunctions._24_8_; p_Var5 != local_130;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    p_Var1 = p_Var5[1]._M_parent;
    plVar6 = (long *)(*(long *)(p_Var5 + 1) + 0x50);
    local_128 = *(long *)(p_Var5 + 1) + 0x48;
    while( true ) {
      lVar2 = *plVar6;
      if (lVar2 == local_128) break;
      pBVar7 = (BasicBlock *)(lVar2 + -0x18);
      if (lVar2 == 0) {
        pBVar7 = (BasicBlock *)0x0;
      }
      local_148._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar7;
      local_120 = lVar2;
      ppBVar4 = std::
                map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                ::operator[]((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                              *)(p_Var1 + 3),(key_type *)&local_148);
      b = *ppBVar4;
      LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
                ((ValVec *)&local_148,&local_108,pBVar7);
      ppVVar3 = local_148._M_impl.super__Vector_impl_data._M_finish;
      for (pBVar8 = (BasicBlock *)local_148._M_impl.super__Vector_impl_data._M_start;
          pBVar8 != (BasicBlock *)ppVVar3; pBVar8 = pBVar8 + 8) {
        local_110 = *(key_type *)pBVar8;
        ppBVar4 = std::
                  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                  ::operator[]((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                                *)(p_Var1 + 3),&local_110);
        BBlock<dg::LLVMNode>::addControlDependence(*ppBVar4,b);
      }
      std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base(&local_148);
      pBVar8 = pBVar7 + 0x30;
      local_118 = pBVar7 + 0x28;
      while( true ) {
        pBVar8 = *(BasicBlock **)pBVar8;
        if (pBVar8 == local_118) break;
        v = (Value *)(pBVar8 + -0x18);
        if (pBVar8 == (BasicBlock *)0x0) {
          v = (Value *)0x0;
        }
        LLVMControlDependenceAnalysis::_getDependencies<llvm::Instruction_const*>
                  ((ValVec *)&local_148,&local_108,(Instruction *)v);
        ppVVar3 = local_148._M_impl.super__Vector_impl_data._M_finish;
        for (pBVar7 = (BasicBlock *)local_148._M_impl.super__Vector_impl_data._M_start;
            pBVar7 != (BasicBlock *)ppVVar3; pBVar7 = pBVar7 + 8) {
          this_00 = DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                              ((DependenceGraph<dg::LLVMNode> *)p_Var5[1]._M_parent,
                               *(Value **)pBVar7);
          n = DependenceGraph<dg::LLVMNode>::_getNode<llvm::Value*>
                        ((DependenceGraph<dg::LLVMNode> *)p_Var5[1]._M_parent,v);
          Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                    (&this_00->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,n);
        }
        std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base(&local_148);
        pBVar8 = pBVar8 + 8;
      }
      plVar6 = (long *)(local_120 + 8);
    }
  }
  LLVMControlDependenceAnalysis::~LLVMControlDependenceAnalysis(&local_108);
  return;
}

Assistant:

void LLVMDependenceGraph::computeNTSCD(
        const LLVMControlDependenceAnalysisOptions &opts) {
    DBG_SECTION_BEGIN(llvmdg, "Filling in CDA edges (NTSCD)");
    dg::LLVMControlDependenceAnalysis ntscd(this->module, opts);
    assert(opts.ntscdCD() || opts.ntscd2CD());

    for (const auto &it : getConstructedFunctions()) {
        auto &blocks = it.second->getBlocks();
        for (auto &BB : *llvm::cast<llvm::Function>(it.first)) {
            auto *bb = blocks[&BB];
            assert(bb);
            for (auto *dep : ntscd.getDependencies(&BB)) {
                auto *depbb = blocks[dep];
                assert(depbb);
                depbb->addControlDependence(bb);
            }

            for (auto &I : BB) {
                for (auto *dep : ntscd.getDependencies(&I)) {
                    auto *depnd = it.second->getNode(dep);
                    assert(depnd);
                    auto *ind = it.second->getNode(&I);
                    assert(ind);
                    depnd->addControlDependence(ind);
                }
            }
        }
    }

    DBG_SECTION_END(llvmdg, "Done computing CDA edges");
}